

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode Curl_http2_setup(Curl_easy *data,connectdata *conn)

{
  HTTP *pHVar1;
  HTTP *stream;
  http_conn *httpc;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pHVar1 = (data->req).p.http;
  pHVar1->stream_id = -1;
  Curl_dyn_init(&pHVar1->header_recvbuf,0x20000);
  Curl_dyn_init(&pHVar1->trailer_recvbuf,0x20000);
  pHVar1->upload_left = 0;
  pHVar1->upload_mem = (uint8_t *)0x0;
  pHVar1->upload_len = 0;
  pHVar1->mem = (data->state).buffer;
  pHVar1->len = (ulong)(data->set).buffer_size;
  multi_connchanged(data->multi);
  if ((conn->handler == &Curl_handler_http2_ssl) || (conn->handler == &Curl_handler_http2)) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    if ((conn->handler->flags & 1) == 0) {
      conn->handler = &Curl_handler_http2;
    }
    else {
      conn->handler = &Curl_handler_http2_ssl;
    }
    data_local._4_4_ = http2_init(data,conn);
    if (data_local._4_4_ == CURLE_OK) {
      Curl_infof(data,"Using HTTP2, server supports multiplexing");
      *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfeffffff | 0x1000000;
      conn->httpversion = '\x14';
      conn->bundle->multiuse = 2;
      (conn->proto).ftpc.pp.endofresp =
           (_func__Bool_Curl_easy_ptr_connectdata_ptr_char_ptr_size_t_int_ptr *)0x0;
      (conn->proto).ftpc.entrypath = (char *)0x0;
      (conn->proto).httpc.pause_stream_id = 0;
      (conn->proto).ftpc.dirs = (char **)0x0;
      data_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_dyn_free(&pHVar1->header_recvbuf);
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http2_setup(struct Curl_easy *data,
                          struct connectdata *conn)
{
  CURLcode result;
  struct http_conn *httpc = &conn->proto.httpc;
  struct HTTP *stream = data->req.p.http;

  DEBUGASSERT(data->state.buffer);

  stream->stream_id = -1;

  Curl_dyn_init(&stream->header_recvbuf, DYN_H2_HEADERS);
  Curl_dyn_init(&stream->trailer_recvbuf, DYN_H2_TRAILERS);

  stream->upload_left = 0;
  stream->upload_mem = NULL;
  stream->upload_len = 0;
  stream->mem = data->state.buffer;
  stream->len = data->set.buffer_size;

  multi_connchanged(data->multi);
  /* below this point only connection related inits are done, which only needs
     to be done once per connection */

  if((conn->handler == &Curl_handler_http2_ssl) ||
     (conn->handler == &Curl_handler_http2))
    return CURLE_OK; /* already done */

  if(conn->handler->flags & PROTOPT_SSL)
    conn->handler = &Curl_handler_http2_ssl;
  else
    conn->handler = &Curl_handler_http2;

  result = http2_init(data, conn);
  if(result) {
    Curl_dyn_free(&stream->header_recvbuf);
    return result;
  }

  infof(data, "Using HTTP2, server supports multiplexing");

  conn->bits.multiplex = TRUE; /* at least potentially multiplexed */
  conn->httpversion = 20;
  conn->bundle->multiuse = BUNDLE_MULTIPLEX;

  httpc->inbuflen = 0;
  httpc->nread_inbuf = 0;

  httpc->pause_stream_id = 0;
  httpc->drain_total = 0;

  return CURLE_OK;
}